

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggressive_dead_code_elim_pass.cpp
# Opt level: O2

void __thiscall
spvtools::opt::AggressiveDCEPass::InitializeWorkList
          (AggressiveDCEPass *this,Function *func,
          list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
          *structured_order)

{
  Op OVar1;
  Instruction *this_00;
  bool bVar2;
  uint32_t uVar3;
  long lVar4;
  Instruction **ppIVar5;
  uint32_t var_id;
  uint32_t var_id_1;
  uint32_t local_40;
  uint32_t local_3c;
  _List_node_base *local_38;
  
  AddToWorklist(this,(func->def_inst_)._M_t.
                     super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                     .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl);
  MarkFunctionParameterAsLive(this,func);
  MarkFirstBlockAsLive(this,func);
  local_38 = (_List_node_base *)structured_order;
  do {
    structured_order =
         (list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> *)
         (((_List_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> *)
          &((_List_node_base *)structured_order)->_M_next)->_M_impl)._M_node.super__List_node_base.
         _M_next;
    if ((_List_node_base *)structured_order == local_38) {
      return;
    }
    lVar4 = (long)((_List_node_base *)((long)structured_order + 0x10))->_M_next;
    ppIVar5 = (Instruction **)(lVar4 + 0x20);
    while (this_00 = *ppIVar5, this_00 != (Instruction *)(lVar4 + 0x18)) {
      OVar1 = this_00->opcode_;
      bVar2 = Instruction::IsBranch(this_00);
      if ((!bVar2) &&
         ((9 < OVar1 - OpLoopMerge || ((0x203U >> (OVar1 - OpLoopMerge & 0x1f) & 1) == 0)))) {
        if (OVar1 - OpCopyMemory < 2) {
          local_40 = 0;
          uVar3 = Instruction::GetSingleWordInOperand(this_00,0);
          MemPass::GetPtr(&this->super_MemPass,uVar3,&local_40);
          uVar3 = local_40;
LAB_004ac982:
          bVar2 = IsLocalVar(this,uVar3,func);
        }
        else {
          if (OVar1 == OpStore) {
            local_3c = 0;
            MemPass::GetPtr(&this->super_MemPass,this_00,&local_3c);
            uVar3 = local_3c;
            goto LAB_004ac982;
          }
          bVar2 = Instruction::IsOpcodeSafeToDelete(this_00);
        }
        if (bVar2 == false) {
          AddToWorklist(this,this_00);
        }
      }
      lVar4 = (long)((_List_node_base *)((long)structured_order + 0x10))->_M_next;
      ppIVar5 = &(this_00->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
    }
  } while( true );
}

Assistant:

void AggressiveDCEPass::InitializeWorkList(
    Function* func, std::list<BasicBlock*>& structured_order) {
  AddToWorklist(&func->DefInst());
  MarkFunctionParameterAsLive(func);
  MarkFirstBlockAsLive(func);

  // Add instructions with external side effects to the worklist. Also add
  // branches that are not attached to a structured construct.
  // TODO(s-perron): The handling of branch seems to be adhoc.  This needs to be
  // cleaned up.
  for (auto& bi : structured_order) {
    for (auto ii = bi->begin(); ii != bi->end(); ++ii) {
      spv::Op op = ii->opcode();
      if (ii->IsBranch()) {
        continue;
      }
      switch (op) {
        case spv::Op::OpStore: {
          uint32_t var_id = 0;
          (void)GetPtr(&*ii, &var_id);
          if (!IsLocalVar(var_id, func)) AddToWorklist(&*ii);
        } break;
        case spv::Op::OpCopyMemory:
        case spv::Op::OpCopyMemorySized: {
          uint32_t var_id = 0;
          uint32_t target_addr_id =
              ii->GetSingleWordInOperand(kCopyMemoryTargetAddrInIdx);
          (void)GetPtr(target_addr_id, &var_id);
          if (!IsLocalVar(var_id, func)) AddToWorklist(&*ii);
        } break;
        case spv::Op::OpLoopMerge:
        case spv::Op::OpSelectionMerge:
        case spv::Op::OpUnreachable:
          break;
        default: {
          // Function calls, atomics, function params, function returns, etc.
          if (!ii->IsOpcodeSafeToDelete()) {
            AddToWorklist(&*ii);
          }
        } break;
      }
    }
  }
}